

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TStokesAnalytic::uxy<double>(TStokesAnalytic *this,TPZVec<double> *x,TPZVec<double> *flux)

{
  double *pdVar1;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  long in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  size_t in_stack_000000e8;
  char *in_stack_000000f0;
  REAL xs;
  REAL lambda;
  REAL Re;
  double x3;
  double x2;
  double x1;
  
  pdVar1 = TPZVec<double>::operator[](in_RSI,0);
  dVar5 = *pdVar1;
  pdVar1 = TPZVec<double>::operator[](in_RSI,1);
  dVar2 = *pdVar1;
  pdVar1 = TPZVec<double>::operator[](in_RSI,2);
  dVar7 = *pdVar1;
  switch(*(undefined4 *)(in_RDI + 0x14)) {
  case 2:
  case 3:
    dVar7 = 1.0 / *(double *)(in_RDI + 0x18);
    dVar6 = sqrt(*(double *)(in_RDI + 0x28) * 4.0 * *(double *)(in_RDI + 0x28) +
                 (dVar7 * dVar7) / 4.0);
    dVar6 = dVar7 / 2.0 - dVar6;
    dVar7 = ::exp(dVar6 * dVar5);
    dVar3 = cos(*(double *)(in_RDI + 0x28) * 2.0 * dVar2);
    pdVar1 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar1 = -dVar7 * dVar3 + 1.0;
    dVar7 = *(double *)(in_RDI + 0x28);
    dVar5 = ::exp(dVar6 * dVar5);
    dVar2 = sin(*(double *)(in_RDI + 0x28) * 2.0 * dVar2);
    pdVar1 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar1 = (dVar6 / (dVar7 * 2.0)) * dVar5 * dVar2;
    break;
  case 4:
    dVar7 = sin(dVar5);
    dVar6 = sin(dVar2);
    pdVar1 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar1 = dVar7 * -1.0 * dVar6;
    dVar5 = cos(dVar5);
    dVar2 = cos(dVar2);
    pdVar1 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar1 = dVar5 * -1.0 * dVar2;
    break;
  case 5:
    pdVar1 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar1 = dVar5 * 0.0;
    pdVar1 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar1 = dVar5 * 0.0;
    break;
  case 6:
    dVar6 = sin(dVar5);
    dVar3 = sin(dVar2);
    pdVar1 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar1 = -dVar6 * dVar3;
    dVar5 = cos(dVar5);
    dVar6 = cos(dVar2);
    dVar3 = sin(dVar2);
    dVar4 = sin(dVar7);
    pdVar1 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar1 = -dVar5 * dVar6 + -(dVar3 * dVar4);
    dVar5 = cos(dVar2);
    dVar2 = cos(dVar7);
    pdVar1 = TPZVec<double>::operator[](in_RDX,2);
    *pdVar1 = -dVar5 * dVar2;
    break;
  case 7:
    pdVar1 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar1 = dVar5;
    pdVar1 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar1 = -dVar2;
    break;
  default:
    pzinternal::DebugStopImpl(in_stack_000000f0,in_stack_000000e8);
    break;
  case 10:
    dVar7 = ::exp(*(double *)(in_RDI + 0x30) / *(double *)(in_RDI + 0x18));
    dVar7 = 1.0 / dVar7;
    dVar6 = sin(dVar5);
    dVar3 = sin(dVar2);
    dVar4 = sin(dVar5);
    dVar8 = sin(dVar2);
    pdVar1 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar1 = -dVar7 * dVar6 * dVar3 + (1.0 - dVar7) * dVar4 * dVar8;
    dVar6 = cos(dVar5);
    dVar3 = cos(dVar2);
    dVar5 = cos(dVar5);
    dVar2 = cos(dVar2);
    pdVar1 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar1 = -dVar7 * dVar6 * dVar3 + -((1.0 - dVar7) * dVar5 * dVar2);
    break;
  case 0xb:
    dVar6 = ::exp(*(double *)(in_RDI + 0x30) / *(double *)(in_RDI + 0x18));
    dVar6 = 1.0 / dVar6;
    dVar3 = sin(dVar5);
    dVar4 = sin(dVar2);
    dVar8 = sin(dVar5);
    dVar9 = sin(dVar2);
    pdVar1 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar1 = -dVar6 * dVar3 * dVar4 + (1.0 - dVar6) * dVar8 * dVar9;
    dVar3 = cos(dVar5);
    dVar4 = cos(dVar2);
    dVar8 = sin(dVar2);
    dVar9 = sin(dVar7);
    dVar5 = cos(dVar5);
    dVar10 = cos(dVar2);
    dVar11 = sin(dVar2);
    dVar12 = sin(dVar7);
    pdVar1 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar1 = dVar6 * (-dVar3 * dVar4 + -(dVar8 * dVar9)) +
              (1.0 - dVar6) * (-dVar5 * dVar10 + dVar11 * dVar12);
    dVar5 = cos(dVar2);
    dVar3 = cos(dVar7);
    dVar2 = cos(dVar2);
    dVar7 = cos(dVar7);
    pdVar1 = TPZVec<double>::operator[](in_RDX,2);
    *pdVar1 = -dVar6 * dVar5 * dVar3 + (1.0 - dVar6) * -dVar2 * dVar7;
    break;
  case 0xc:
    dVar6 = cos(*(double *)(in_RDI + 0x28) * dVar5);
    dVar3 = sin(*(double *)(in_RDI + 0x28) * dVar2);
    dVar4 = sin(*(double *)(in_RDI + 0x28) * dVar7);
    pdVar1 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar1 = dVar6 * dVar3 * dVar4;
    dVar6 = sin(*(double *)(in_RDI + 0x28) * dVar5);
    dVar3 = cos(*(double *)(in_RDI + 0x28) * dVar2);
    dVar4 = sin(*(double *)(in_RDI + 0x28) * dVar7);
    pdVar1 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar1 = dVar6 * dVar3 * dVar4;
    dVar5 = sin(*(double *)(in_RDI + 0x28) * dVar5);
    dVar2 = sin(*(double *)(in_RDI + 0x28) * dVar2);
    dVar7 = cos(*(double *)(in_RDI + 0x28) * dVar7);
    pdVar1 = TPZVec<double>::operator[](in_RDX,2);
    *pdVar1 = dVar5 * -2.0 * dVar2 * dVar7;
    break;
  case 0xd:
    if (0.0 <= dVar2) {
      if (0.0 <= dVar2) {
        dVar7 = *(double *)(in_RDI + 0x28);
        dVar6 = sin(*(double *)(in_RDI + 0x28) * dVar2);
        dVar3 = cos(*(double *)(in_RDI + 0x28) * dVar2);
        dVar4 = cos(dVar5);
        pdVar1 = TPZVec<double>::operator[](in_RDX,0);
        *pdVar1 = (2.0 / dVar7) * dVar6 * dVar3 * dVar4;
        dVar7 = *(double *)(in_RDI + 0x28);
        dVar6 = *(double *)(in_RDI + 0x28);
        dVar3 = sin(*(double *)(in_RDI + 0x28) * dVar2);
        dVar2 = sin(*(double *)(in_RDI + 0x28) * dVar2);
        dVar5 = sin(dVar5);
        pdVar1 = TPZVec<double>::operator[](in_RDX,1);
        *pdVar1 = ((1.0 / (dVar7 * dVar6)) * dVar3 * dVar2 + -2.0) * dVar5;
      }
    }
    else {
      dVar7 = ::exp(-dVar2);
      dVar6 = ::exp(dVar2);
      dVar3 = cos(dVar5);
      pdVar1 = TPZVec<double>::operator[](in_RDX,0);
      *pdVar1 = (dVar7 - dVar6) * dVar3;
      dVar7 = ::exp(-dVar2);
      dVar2 = ::exp(dVar2);
      dVar5 = sin(dVar5);
      pdVar1 = TPZVec<double>::operator[](in_RDX,1);
      *pdVar1 = -(dVar7 + dVar2) * dVar5;
    }
    break;
  case 0xe:
    if (1.0 <= dVar2) {
      if (1.0 <= dVar2) {
        dVar7 = cos((*(double *)(in_RDI + 0x28) * dVar2) / 2.0);
        dVar6 = cos((*(double *)(in_RDI + 0x28) * dVar2) / 2.0);
        dVar3 = sin((*(double *)(in_RDI + 0x28) * dVar5) / 2.0);
        pdVar1 = TPZVec<double>::operator[](in_RDX,0);
        *pdVar1 = dVar7 * dVar6 * dVar3;
        dVar7 = cos((*(double *)(in_RDI + 0x28) * dVar5) / 2.0);
        dVar6 = sin(*(double *)(in_RDI + 0x28) * dVar2);
        dVar5 = *(double *)(in_RDI + 0x28);
        pdVar1 = TPZVec<double>::operator[](in_RDX,1);
        *pdVar1 = -dVar7 * (dVar6 * 0.25 + (dVar5 * dVar2) / 4.0);
      }
    }
    else {
      dVar7 = *(double *)(in_RDI + 0x28);
      dVar6 = *(double *)(in_RDI + 0x28);
      dVar3 = sin((*(double *)(in_RDI + 0x28) * dVar5) / 2.0);
      dVar4 = sin(1.0 - dVar2);
      pdVar1 = TPZVec<double>::operator[](in_RDX,0);
      *pdVar1 = dVar7 * -0.125 * dVar6 * dVar2 * dVar3 * dVar4;
      dVar7 = *(double *)(in_RDI + 0x28);
      dVar5 = cos((*(double *)(in_RDI + 0x28) * dVar5) / 2.0);
      dVar6 = cos(1.0 - dVar2);
      dVar3 = sin(1.0 - dVar2);
      pdVar1 = TPZVec<double>::operator[](in_RDX,1);
      *pdVar1 = dVar7 * 0.25 * dVar5 * (-dVar2 * dVar6 + dVar3);
    }
  }
  return;
}

Assistant:

void TStokesAnalytic::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &flux) const
{
    TVar x1 = x[0];
    TVar x2 = x[1];
    TVar x3 = x[2];
    REAL Re = 0.;
    REAL lambda = 0.;
    REAL xs = 0.; 
    
    switch(fExactSol)
    {
        case ESinCos:
            flux[0] = -1.*sin(x1)*sin(x2);
            flux[1] = -1.*cos(x1)*cos(x2);
            break;
        case ENoFlow:
            flux[0] = x1*0.;
            flux[1] = x1*0.;
            break;
        case ESinCosBDS:
	    if(fvisco==0) xs = 0.;
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = -xs*cos(x1)*cos(x2)-(1.-xs)*cos(x1)*cos(x2);
            break;
	case ECouplingSD:
	    if(x2<0.){
		flux[0] = (exp(-x2)-exp(x2))*cos(x1);
		flux[1] = -(exp(-x2)+exp(x2))*sin(x1);			
	    }else if(x2>=0.){
		flux[0] = (2./Pi)*sin(Pi*x2)*cos(Pi*x2)*cos(x1);
		flux[1] = ((1./(Pi*Pi))*sin(Pi*x2)*sin(Pi*x2)-2.)*sin(x1);	
	    }
	    break;
	case ECouplingNSD:
	    if(x2<1.){
		flux[0] = -(1./8.)*Pi*Pi*x2*sin(Pi*x1/2.)*sin(1.-x2);
		flux[1] = (1./4.)*Pi*cos(Pi*x1/2.)*(-x2*cos(1.-x2)+sin(1.-x2));			
	    }else if(x2>=1.){
	        flux[0] = cos(Pi*x2/2.)*cos(Pi*x2/2.)*sin(Pi*x1/2.);
	        flux[1] = -cos(Pi*x1/2.)*((1./4.)*sin(Pi*x2)+Pi*x2/4.);	
	    }
	    break;
	case ESinCosBDS3D:
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = xs*(-cos(x1)*cos(x2)-sin(x2)*sin(x3))+(1.-xs)*(-cos(x1)*cos(x2)+sin(x2)*sin(x3));
            flux[2] = -xs*cos(x2)*cos(x3)+(1.-xs)*(-cos(x2)*cos(x3));
            break;
	case EGatica3D:
    	    flux[0] = cos(Pi*x1)*sin(Pi*x2)*sin(Pi*x3);
	    flux[1] = sin(Pi*x1)*cos(Pi*x2)*sin(Pi*x3);
	    flux[2] = -2.*sin(Pi*x1)*sin(Pi*x2)*cos(Pi*x3);
	break;
        case ESinCos3D:
            flux[0] = -sin(x1)*sin(x2);
            flux[1] = -cos(x1)*cos(x2)-sin(x2)*sin(x3);
            flux[2] = -cos(x2)*cos(x3);
            break;
        case EKovasznay:
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - exp(lambda*x1)*cos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*exp(lambda*x1)*sin(2.*Pi*x2);
            break;
        case EPconst:
            flux[0] = x1;
            flux[1] = -x2;
            break;
        default:
            DebugStop();
    }
}